

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_PoolAllocator.h
# Opt level: O2

Branch * __thiscall
soul::PoolAllocator::allocate<soul::heart::Branch,soul::pool_ref<soul::heart::Block>&>
          (PoolAllocator *this,pool_ref<soul::heart::Block> *args)

{
  Block *pBVar1;
  PoolItem *pPVar2;
  
  pPVar2 = allocateSpaceForObject(this,0x58);
  pBVar1 = args->object;
  *(undefined8 *)&pPVar2->field_0x18 = 0;
  pPVar2[1].size = 0;
  pPVar2->item = &PTR__Branch_002fbee0;
  pPVar2[1].destructor = (DestructorFn *)pBVar1;
  pPVar2[1].item = &pPVar2[2].destructor;
  *(undefined8 *)&pPVar2[1].field_0x18 = 0;
  pPVar2[2].size = 4;
  pPVar2->destructor =
       allocate<soul::heart::Branch,_soul::pool_ref<soul::heart::Block>_&>::anon_class_1_0_00000001
       ::__invoke;
  return (Branch *)&pPVar2->item;
}

Assistant:

Type& allocate (Args&&... args)
    {
        static_assert (sizeof (Type) + itemHeaderSize <= sizeof (Pool::space), "Can't allocate a pool object bigger than the pool block size");
        auto& newItem = allocateSpaceForObject (sizeof (Type));
        auto newObject = new (std::addressof (newItem.item)) Type (std::forward<Args> (args)...);

        // NB: the constructor may throw, so we have to be careful not to register its destructor until afterwards
        if constexpr (! std::is_trivially_destructible<Type>::value)
            newItem.destructor = [] (void* t) { static_cast<Type*> (t)->~Type(); };

        return *newObject;
    }